

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [4],Vector<char> *params_1,
          char *params_2)

{
  char (*value) [4];
  Vector<char> *value_00;
  char *value_01;
  char local_49 [1];
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  Vector<char> *local_28;
  char *params_local_2;
  Vector<char> *params_local_1;
  char (*params_local) [4];
  
  local_28 = params_1;
  params_local_2 = *params;
  params_local_1 = (Vector<char> *)this;
  params_local = (char (*) [4])__return_storage_ptr__;
  value = ::const((char (*) [4])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[4]>(value);
  value_00 = fwd<kj::Vector<char>&>((Vector<char> *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<kj::Vector<char>&>(value_00);
  value_01 = fwd<char>((NoInfer<char> *)local_28);
  local_49[0] = (char)_::toStringTreeOrCharSequence<char>(value_01);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,
             (ArrayPtr<const_char> *)local_49,(FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}